

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O0

void m256v_copy_col(m256v *M1,int c1,m256v *Mt,int ct)

{
  int in_ECX;
  m256v *in_RDX;
  int i;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  m256v *pmVar1;
  int c;
  int iVar2;
  int iVar3;
  
  c = 0;
  while (c < in_RDX->n_row) {
    pmVar1 = in_RDX;
    iVar2 = c;
    iVar3 = in_ECX;
    m256v_get_el(in_RDX,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    m256v_set_el((m256v *)CONCAT44(iVar3,iVar2),in_ECX,c,(uint8_t)((ulong)pmVar1 >> 0x38));
    in_ECX = iVar3;
    c = iVar2 + 1;
  }
  return;
}

Assistant:

void m256v_copy_col(const m256v* M1,
			int c1,
			m256v* Mt,
			int ct)
{
	assert (M1->n_row == Mt->n_row);

	for (int i = 0; i < Mt->n_row; ++i) {
		set_el(Mt, i, ct, get_el(M1, i, c1));
	}
}